

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

void secp256k1_fe_verify(secp256k1_fe *a)

{
  long in_RDI;
  int in_stack_ffffffffffffffec;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  undefined1 uVar1;
  
  secp256k1_fe_verify_magnitude
            ((secp256k1_fe *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),
             in_stack_ffffffffffffffec);
  uVar1 = true;
  if (*(int *)(in_RDI + 0x2c) != 0) {
    uVar1 = *(int *)(in_RDI + 0x2c) == 1;
  }
  if (((uVar1 ^ 0xff) & 1) != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/field_impl.h"
            ,0x9d,"test condition failed: (a->normalized == 0) || (a->normalized == 1)");
    abort();
  }
  if (*(int *)(in_RDI + 0x2c) != 0) {
    secp256k1_fe_verify_magnitude
              ((secp256k1_fe *)CONCAT17(uVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  }
  secp256k1_fe_impl_verify((secp256k1_fe *)CONCAT17(uVar1,in_stack_fffffffffffffff0));
  return;
}

Assistant:

static void secp256k1_fe_verify(const secp256k1_fe *a) {
    /* Magnitude between 0 and 32. */
    SECP256K1_FE_VERIFY_MAGNITUDE(a, 32);
    /* Normalized is 0 or 1. */
    VERIFY_CHECK((a->normalized == 0) || (a->normalized == 1));
    /* If normalized, magnitude must be 0 or 1. */
    if (a->normalized) SECP256K1_FE_VERIFY_MAGNITUDE(a, 1);
    /* Invoke implementation-specific checks. */
    secp256k1_fe_impl_verify(a);
}